

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::removeCollisionObject
          (cbtCollisionWorld *this,cbtCollisionObject *collisionObject)

{
  int iVar1;
  cbtBroadphaseProxy *pcVar2;
  cbtCollisionObject **ppcVar3;
  cbtCollisionObject *pcVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  cbtCollisionObject *local_18;
  
  pcVar2 = collisionObject->m_broadphaseHandle;
  local_18 = collisionObject;
  if (pcVar2 != (cbtBroadphaseProxy *)0x0) {
    iVar5 = (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[9])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x50))
              ((long *)CONCAT44(extraout_var,iVar5),pcVar2,this->m_dispatcher1);
    (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[3])
              (this->m_broadphasePairCache,pcVar2,this->m_dispatcher1);
    local_18->m_broadphaseHandle = (cbtBroadphaseProxy *)0x0;
  }
  iVar5 = local_18->m_worldArrayIndex;
  lVar6 = (long)iVar5;
  if (-1 < lVar6) {
    iVar1 = (this->m_collisionObjects).m_size;
    if (iVar5 < iVar1) {
      ppcVar3 = (this->m_collisionObjects).m_data;
      pcVar4 = ppcVar3[lVar6];
      ppcVar3[lVar6] = ppcVar3[(long)iVar1 + -1];
      (this->m_collisionObjects).m_data[(long)iVar1 + -1] = pcVar4;
      (this->m_collisionObjects).m_size = iVar1 + -1;
      if (iVar5 < iVar1 + -1) {
        (this->m_collisionObjects).m_data[lVar6]->m_worldArrayIndex = iVar5;
      }
      goto LAB_008cf63f;
    }
  }
  cbtAlignedObjectArray<cbtCollisionObject_*>::remove(&this->m_collisionObjects,(char *)&local_18);
LAB_008cf63f:
  local_18->m_worldArrayIndex = -1;
  return;
}

Assistant:

void cbtCollisionWorld::removeCollisionObject(cbtCollisionObject* collisionObject)
{
	//bool removeFromBroadphase = false;

	{
		cbtBroadphaseProxy* bp = collisionObject->getBroadphaseHandle();
		if (bp)
		{
			//
			// only clear the cached algorithms
			//
			getBroadphase()->getOverlappingPairCache()->cleanProxyFromPairs(bp, m_dispatcher1);
			getBroadphase()->destroyProxy(bp, m_dispatcher1);
			collisionObject->setBroadphaseHandle(0);
		}
	}

	int iObj = collisionObject->getWorldArrayIndex();
	//    cbtAssert(iObj >= 0 && iObj < m_collisionObjects.size()); // trying to remove an object that was never added or already removed previously?
	if (iObj >= 0 && iObj < m_collisionObjects.size())
	{
		cbtAssert(collisionObject == m_collisionObjects[iObj]);
		m_collisionObjects.swap(iObj, m_collisionObjects.size() - 1);
		m_collisionObjects.pop_back();
		if (iObj < m_collisionObjects.size())
		{
			m_collisionObjects[iObj]->setWorldArrayIndex(iObj);
		}
	}
	else
	{
		// slow linear search
		//swapremove
		m_collisionObjects.remove(collisionObject);
	}
	collisionObject->setWorldArrayIndex(-1);
}